

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Policy policy;
  Policy policy_00;
  Policy policy_01;
  bool bVar1;
  int iVar2;
  Cache *pCVar3;
  Cache *this;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  elfio reader;
  Simulator simulator;
  MemoryManager memory;
  BranchPredictor branch_predictor;
  allocator local_6439;
  undefined8 local_6438;
  undefined8 uStack_6430;
  undefined4 local_6428;
  undefined8 local_6418;
  undefined8 uStack_6410;
  undefined4 local_6408;
  undefined8 local_63f8;
  undefined8 uStack_63f0;
  undefined4 local_63e8;
  string local_63d8;
  elfio local_63b8;
  Simulator local_6360;
  MemoryManager local_6048;
  BranchPredictor local_4040;
  uint64_t pc;
  
  bVar1 = parsePara(argc,argv);
  if (!bVar1) {
    printUsage();
    exit(-1);
  }
  MemoryManager::MemoryManager(&local_6048);
  pCVar3 = (Cache *)operator_new(0x80);
  local_63f8 = 0x4000800000;
  uStack_63f0 = 0x800020000;
  local_63e8 = 0x13;
  policy.block_num = 0x20000;
  policy.associativity = 8;
  policy.cache_size = 0x800000;
  policy.block_size = 0x40;
  policy.hit_latency = 0x13;
  Cache::Cache(pCVar3,&local_6048,policy,(Cache *)0x0,true,true,0);
  l3_cache = pCVar3;
  this = (Cache *)operator_new(0x80);
  local_6418 = 0x4000040000;
  uStack_6410 = 0x800001000;
  local_6408 = 7;
  policy_00.block_num = 0x1000;
  policy_00.associativity = 8;
  policy_00.cache_size = 0x40000;
  policy_00.block_size = 0x40;
  policy_00.hit_latency = 7;
  Cache::Cache(this,&local_6048,policy_00,pCVar3,true,true,0);
  l2_cache = this;
  pCVar3 = (Cache *)operator_new(0x80);
  local_6438 = 0x4000008000;
  uStack_6430 = 0x800000200;
  local_6428 = 0;
  policy_01.block_num = 0x200;
  policy_01.associativity = 8;
  policy_01.cache_size = 0x8000;
  policy_01.block_size = 0x40;
  policy_01.hit_latency = 0;
  Cache::Cache(pCVar3,&local_6048,policy_01,this,true,true,0);
  l1_cache = pCVar3;
  MemoryManager::setCache(&local_6048,pCVar3);
  BranchPredictor::BranchPredictor(&local_4040,strategy);
  Simulator::Simulator(&local_6360,&local_6048,&local_4040);
  ELFIO::elfio::elfio(&local_63b8);
  std::__cxx11::string::string((string *)&local_63d8,elf_file_name,&local_6439);
  bVar1 = ELFIO::elfio::load(&local_63b8,&local_63d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_63d8._M_dataplus._M_p != &local_63d8.field_2) {
    operator_delete(local_63d8._M_dataplus._M_p);
  }
  if (!bVar1) {
    main_cold_1();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_63d8._M_dataplus._M_p != &local_63d8.field_2) {
      operator_delete(local_63d8._M_dataplus._M_p);
    }
    ELFIO::elfio::~elfio(&local_63b8);
    Simulator::~Simulator(&local_6360);
    BranchPredictor::~BranchPredictor(&local_4040);
    MemoryManager::~MemoryManager(&local_6048);
    _Unwind_Resume(extraout_RAX);
  }
  loadElf(&local_63b8,&local_6048);
  if (verbose == true) {
    MemoryManager::printInfo(&local_6048);
  }
  local_6360.is_single_step = single_step;
  local_6360.is_verbose = verbose;
  local_6360.is_dump_history = dump_history;
  Simulator::initStack(&local_6360,0x80000000,0x400000);
  if (local_63b8.header != (elf_header *)0x0) {
    (*(local_63b8.header)->_vptr_elf_header[0x16])();
    if (local_63b8.header != (elf_header *)0x0) {
      iVar2 = (*(local_63b8.header)->_vptr_elf_header[0x16])();
      pc = CONCAT44(extraout_var,iVar2);
      goto LAB_00104cf2;
    }
  }
  pc = 0;
LAB_00104cf2:
  Simulator::run(&local_6360,pc);
  pCVar3 = l1_cache;
  if (l1_cache != (Cache *)0x0) {
    std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector(&l1_cache->blocks);
  }
  operator_delete(pCVar3);
  pCVar3 = l2_cache;
  if (l2_cache != (Cache *)0x0) {
    std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector(&l2_cache->blocks);
  }
  operator_delete(pCVar3);
  pCVar3 = l3_cache;
  if (l3_cache != (Cache *)0x0) {
    std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector(&l3_cache->blocks);
  }
  operator_delete(pCVar3);
  ELFIO::elfio::~elfio(&local_63b8);
  Simulator::~Simulator(&local_6360);
  BranchPredictor::~BranchPredictor(&local_4040);
  MemoryManager::~MemoryManager(&local_6048);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    if (!parsePara(argc, argv)) {
        printUsage();
        exit(-1);
    }
    MemoryManager memory;
    Cache::Policy policy;

    policy.cache_size = 8 * 1024 * 1024;
    policy.block_size = 64;
    policy.block_num = policy.cache_size / policy.block_size;
    policy.associativity = 8;
    policy.hit_latency = 19;
//    policy.miss_latency = 100;
    l3_cache = new Cache(&memory, policy, nullptr, true, true);

    policy.cache_size = 256 * 1024;
    policy.block_size = 64;
    policy.block_num = policy.cache_size / policy.block_size;
    policy.associativity = 8;
    policy.hit_latency = 7;
//    policy.miss_latency = 20;
    l2_cache = new Cache(&memory, policy, l3_cache, true, true);

    policy.cache_size = 32 * 1024;
    policy.block_size = 64;
    policy.block_num = policy.cache_size / policy.block_size;
    policy.associativity = 8;
    policy.hit_latency = 0;
//    policy.miss_latency = 8;
    l1_cache = new Cache(&memory, policy, l2_cache, true, true);

    memory.setCache(l1_cache);

    BranchPredictor branch_predictor(strategy);
    Simulator simulator(&memory, &branch_predictor);

    ELFIO::elfio reader;
    if (!reader.load(elf_file_name)) {
        fprintf(stderr, "Failure on loading ELF File\n");
        exit(-1);
    }

    loadElf(&reader, &memory);

    if (verbose) {
//        printELFInfo(&reader);
        memory.printInfo();
    }

    simulator.is_single_step = single_step;
    simulator.is_verbose = verbose;
    simulator.is_dump_history = dump_history;
    simulator.initStack(0x80000000, 0x400000);
//    printf("%d %d %d %d\n",single_step, verbose, dump_history, strategy);
    uint64_t pc = reader.get_entry();
//    printf("Entry: %llx\n", pc);
    simulator.run(reader.get_entry());

//    if(dump_history){
//        simulator.dumpHistory();
//    }
    delete l1_cache;
    delete l2_cache;
    delete l3_cache;

    return 0;
}